

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_sse2.c
# Opt level: O2

void GradientUnfilter_SSE2(uint8_t *prev,uint8_t *in,uint8_t *out,int width)

{
  ulong uVar1;
  ulong uVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  unkuint9 Var27;
  undefined1 auVar28 [11];
  undefined1 auVar29 [15];
  unkuint9 Var30;
  undefined1 auVar31 [11];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [16];
  ulong uVar40;
  int iVar41;
  char cVar42;
  short sVar43;
  short sVar46;
  short sVar47;
  short sVar48;
  short sVar49;
  short sVar50;
  short sVar51;
  undefined1 auVar44 [16];
  short sVar52;
  undefined1 auVar45 [16];
  undefined1 auVar53 [16];
  undefined1 auVar55 [16];
  ulong uVar54;
  long lVar56;
  
  if (prev == (uint8_t *)0x0) {
    HorizontalUnfilter_SSE2((uint8_t *)0x0,in,out,width);
    return;
  }
  uVar4 = *prev;
  uVar5 = *in;
  *out = uVar4 + uVar5;
  if (1 < width) {
    auVar44 = ZEXT116((byte)(uVar4 + uVar5));
    for (uVar40 = 0; uVar40 < (width - 1U & 0x7ffffff8); uVar40 = uVar40 + 8) {
      uVar1 = *(ulong *)(prev + uVar40 + 1);
      uVar2 = *(ulong *)(prev + uVar40);
      auVar6._8_6_ = 0;
      auVar6._0_8_ = uVar1;
      auVar6[0xe] = (char)(uVar1 >> 0x38);
      auVar9._8_4_ = 0;
      auVar9._0_8_ = uVar1;
      auVar9[0xc] = (char)(uVar1 >> 0x30);
      auVar9._13_2_ = auVar6._13_2_;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar1;
      auVar12._12_3_ = auVar9._12_3_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar1;
      auVar15[10] = (char)(uVar1 >> 0x28);
      auVar15._11_4_ = auVar12._11_4_;
      auVar18._8_2_ = 0;
      auVar18._0_8_ = uVar1;
      auVar18._10_5_ = auVar15._10_5_;
      auVar21[8] = (char)(uVar1 >> 0x20);
      auVar21._0_8_ = uVar1;
      auVar21._9_6_ = auVar18._9_6_;
      auVar26._7_8_ = 0;
      auVar26._0_7_ = auVar21._8_7_;
      Var27 = CONCAT81(SUB158(auVar26 << 0x40,7),(char)(uVar1 >> 0x18));
      auVar33._9_6_ = 0;
      auVar33._0_9_ = Var27;
      auVar28._1_10_ = SUB1510(auVar33 << 0x30,5);
      auVar28[0] = (char)(uVar1 >> 0x10);
      auVar34._11_4_ = 0;
      auVar34._0_11_ = auVar28;
      auVar24[2] = (char)(uVar1 >> 8);
      auVar24._0_2_ = (ushort)uVar1;
      auVar24._3_12_ = SUB1512(auVar34 << 0x20,3);
      auVar7._8_6_ = 0;
      auVar7._0_8_ = uVar2;
      auVar7[0xe] = (char)(uVar2 >> 0x38);
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar2;
      auVar10[0xc] = (char)(uVar2 >> 0x30);
      auVar10._13_2_ = auVar7._13_2_;
      auVar13._8_4_ = 0;
      auVar13._0_8_ = uVar2;
      auVar13._12_3_ = auVar10._12_3_;
      auVar16._8_2_ = 0;
      auVar16._0_8_ = uVar2;
      auVar16[10] = (char)(uVar2 >> 0x28);
      auVar16._11_4_ = auVar13._11_4_;
      auVar19._8_2_ = 0;
      auVar19._0_8_ = uVar2;
      auVar19._10_5_ = auVar16._10_5_;
      auVar22[8] = (char)(uVar2 >> 0x20);
      auVar22._0_8_ = uVar2;
      auVar22._9_6_ = auVar19._9_6_;
      auVar29._7_8_ = 0;
      auVar29._0_7_ = auVar22._8_7_;
      Var30 = CONCAT81(SUB158(auVar29 << 0x40,7),(char)(uVar2 >> 0x18));
      auVar35._9_6_ = 0;
      auVar35._0_9_ = Var30;
      auVar31._1_10_ = SUB1510(auVar35 << 0x30,5);
      auVar31[0] = (char)(uVar2 >> 0x10);
      auVar36._11_4_ = 0;
      auVar36._0_11_ = auVar31;
      auVar25[2] = (char)(uVar2 >> 8);
      auVar25._0_2_ = (ushort)uVar2;
      auVar25._3_12_ = SUB1512(auVar36 << 0x20,3);
      uVar3 = *(undefined8 *)(in + uVar40 + 1);
      auVar53 = (undefined1  [16])0x0;
      iVar41 = -7;
      auVar55 = ZEXT416(0xff);
      while( true ) {
        sVar43 = auVar44._0_2_ + (((ushort)uVar1 & 0xff) - ((ushort)uVar2 & 0xff));
        sVar46 = auVar44._2_2_ + (auVar24._2_2_ - auVar25._2_2_);
        sVar47 = auVar44._4_2_ + (auVar28._0_2_ - auVar31._0_2_);
        sVar48 = auVar44._6_2_ + ((short)Var27 - (short)Var30);
        sVar49 = auVar44._8_2_ + (auVar21._8_2_ - auVar22._8_2_);
        sVar50 = auVar44._10_2_ + (auVar15._10_2_ - auVar16._10_2_);
        sVar51 = auVar44._12_2_ + (auVar9._12_2_ - auVar10._12_2_);
        sVar52 = auVar44._14_2_ + ((auVar6._13_2_ >> 8) - (auVar7._13_2_ >> 8));
        auVar44[0] = ((0 < sVar43) * (sVar43 < 0x100) * (char)sVar43 - (0xff < sVar43)) +
                     (char)uVar3;
        auVar44[1] = ((0 < sVar46) * (sVar46 < 0x100) * (char)sVar46 - (0xff < sVar46)) +
                     (char)((ulong)uVar3 >> 8);
        auVar44[2] = ((0 < sVar47) * (sVar47 < 0x100) * (char)sVar47 - (0xff < sVar47)) +
                     (char)((ulong)uVar3 >> 0x10);
        auVar44[3] = ((0 < sVar48) * (sVar48 < 0x100) * (char)sVar48 - (0xff < sVar48)) +
                     (char)((ulong)uVar3 >> 0x18);
        auVar44[4] = ((0 < sVar49) * (sVar49 < 0x100) * (char)sVar49 - (0xff < sVar49)) +
                     (char)((ulong)uVar3 >> 0x20);
        auVar44[5] = ((0 < sVar50) * (sVar50 < 0x100) * (char)sVar50 - (0xff < sVar50)) +
                     (char)((ulong)uVar3 >> 0x28);
        auVar44[6] = ((0 < sVar51) * (sVar51 < 0x100) * (char)sVar51 - (0xff < sVar51)) +
                     (char)((ulong)uVar3 >> 0x30);
        auVar44[7] = ((0 < sVar52) * (sVar52 < 0x100) * (char)sVar52 - (0xff < sVar52)) +
                     (char)((ulong)uVar3 >> 0x38);
        auVar44._8_8_ = 0;
        auVar44 = auVar44 & auVar55;
        auVar53 = auVar53 | auVar44;
        if (iVar41 == 0) break;
        auVar45._0_8_ = auVar44._0_8_ << 8;
        auVar45._8_8_ = auVar44._8_8_ << 8;
        lVar56 = auVar55._8_8_;
        uVar54 = auVar55._0_8_;
        auVar55._0_8_ = uVar54 << 8;
        auVar55._8_8_ = lVar56 << 8 | uVar54 >> 0x38;
        auVar8[0xd] = 0;
        auVar8._0_13_ = auVar45._0_13_;
        auVar8[0xe] = auVar44[6];
        auVar11[0xc] = auVar44[5];
        auVar11._0_12_ = auVar45._0_12_;
        auVar11._13_2_ = auVar8._13_2_;
        auVar14[0xb] = 0;
        auVar14._0_11_ = auVar45._0_11_;
        auVar14._12_3_ = auVar11._12_3_;
        auVar17[10] = auVar44[4];
        auVar17._0_10_ = auVar45._0_10_;
        auVar17._11_4_ = auVar14._11_4_;
        auVar20[9] = 0;
        auVar20._0_9_ = auVar45._0_9_;
        auVar20._10_5_ = auVar17._10_5_;
        auVar23[8] = auVar44[3];
        auVar23._0_8_ = auVar45._0_8_;
        auVar23._9_6_ = auVar20._9_6_;
        auVar32._7_8_ = 0;
        auVar32._0_7_ = auVar23._8_7_;
        auVar37._1_8_ = SUB158(auVar32 << 0x40,7);
        auVar37[0] = auVar44[2];
        auVar37._9_6_ = 0;
        auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
        auVar38[0] = auVar44[1];
        auVar38._11_4_ = 0;
        auVar39._1_12_ = SUB1512(auVar38 << 0x20,3);
        auVar39[0] = auVar44[0];
        auVar39._13_3_ = 0;
        auVar44 = auVar39 << 0x10;
        iVar41 = iVar41 + 1;
      }
      auVar44 = auVar44 >> 0x38;
      *(long *)(out + uVar40 + 1) = auVar53._0_8_;
    }
    for (; uVar40 < width - 1U; uVar40 = uVar40 + 1) {
      iVar41 = ((uint)prev[uVar40 + 1] + (uint)out[uVar40]) - (uint)prev[uVar40];
      if (iVar41 < 1) {
        iVar41 = 0;
      }
      cVar42 = (char)iVar41;
      if (0xfe < iVar41) {
        cVar42 = -1;
      }
      out[uVar40 + 1] = cVar42 + in[uVar40 + 1];
    }
  }
  return;
}

Assistant:

static void GradientUnfilter_SSE2(const uint8_t* prev, const uint8_t* in,
                                  uint8_t* out, int width) {
  if (prev == NULL) {
    HorizontalUnfilter_SSE2(NULL, in, out, width);
  } else {
    out[0] = (uint8_t)(in[0] + prev[0]);  // predict from above
    GradientPredictInverse_SSE2(in + 1, prev + 1, out + 1, width - 1);
  }
}